

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<chrono::robosimian::MeshShape>::
construct<chrono::robosimian::MeshShape,chrono::robosimian::MeshShape>
          (new_allocator<chrono::robosimian::MeshShape> *this,MeshShape *__p,MeshShape *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (__p->m_pos).m_data[0] = (__args->m_pos).m_data[0];
  (__p->m_pos).m_data[1] = (__args->m_pos).m_data[1];
  (__p->m_pos).m_data[2] = (__args->m_pos).m_data[2];
  (__p->m_rot).m_data[0] = (__args->m_rot).m_data[0];
  (__p->m_rot).m_data[1] = (__args->m_rot).m_data[1];
  (__p->m_rot).m_data[2] = (__args->m_rot).m_data[2];
  (__p->m_rot).m_data[3] = (__args->m_rot).m_data[3];
  paVar1 = &(__p->m_name).field_2;
  (__p->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_name)._M_dataplus._M_p;
  paVar2 = &(__args->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->m_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_name).field_2 + 8) = uVar4;
  }
  else {
    (__p->m_name)._M_dataplus._M_p = pcVar3;
    (__p->m_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_name)._M_string_length = (__args->m_name)._M_string_length;
  (__args->m_name)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_name)._M_string_length = 0;
  (__args->m_name).field_2._M_local_buf[0] = '\0';
  __p->m_type = __args->m_type;
  return;
}

Assistant:

inline ChVector<Real>::ChVector(const ChVector<Real>& other) {
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
}